

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O3

UBool u_isgraph_63(UChar32 c)

{
  uint uVar1;
  ulong uVar2;
  
  if ((uint)c < 0xd800) {
    uVar1 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar1 = ((uint)c >> 5) + 0x140;
    if (0xdbff < (uint)c) {
      uVar1 = (uint)c >> 5;
    }
  }
  else {
    uVar2 = 0x11f4;
    if (0x10ffff < (uint)c) goto LAB_0015cd17;
    uVar1 = ((uint)c >> 5 & 0x3f) + (uint)propsTrie_index[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar2 = (ulong)((c & 0x1fU) + (uint)propsTrie_index[uVar1] * 4);
LAB_0015cd17:
  return (0x5f001U >> ((byte)propsTrie_index[uVar2] & 0x1f) & 1) == 0;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_isgraph(UChar32 c) {
    uint32_t props;
    GET_PROPS(c, props);
    /* comparing ==0 returns FALSE for the categories mentioned */
    return (UBool)((CAT_MASK(props)&
                    (U_GC_CC_MASK|U_GC_CF_MASK|U_GC_CS_MASK|U_GC_CN_MASK|U_GC_Z_MASK))
                   ==0);
}